

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O2

uint8_t __thiscall Lexer::nc(Lexer *this)

{
  int32_t *piVar1;
  uint uVar2;
  pointer pcVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  piVar1 = &(this->current_index).col;
  *piVar1 = *piVar1 + 1;
  uVar2 = (this->current_index).index;
  uVar4 = (ulong)(int)uVar2;
  pcVar3 = (this->code_ptr)._M_dataplus._M_p;
  uVar5 = uVar4;
  uVar6 = (ulong)uVar2;
  if (pcVar3[uVar4] == '\r') {
    (this->current_index).col = 0;
    (this->current_index).row = (this->current_index).row + 1;
    uVar5 = uVar4 + 1;
    (this->current_index).index = (int32_t)uVar5;
    uVar6 = uVar5;
    if (pcVar3[uVar4 + 1] != '\n') {
      return pcVar3[uVar4 + 1];
    }
  }
  (this->current_index).index = (int)uVar6 + 1;
  return pcVar3[uVar5];
}

Assistant:

uint8_t Lexer::nc() {
    current_index.col++;
    if (gc() == '\r') {
        current_index.col = 0;
        current_index.row++;
        current_index.index++;
        if (gc() != '\n')return gc();
    }
    return code_ptr[current_index.index++];
}